

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O1

void __thiscall miniros::Publisher::Impl::unadvertise(Impl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TopicManagerPtr tm;
  _Alloc_hider local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if (this->unadvertised_ == false) {
    this->unadvertised_ = true;
    NodeHandle::getTopicManager((NodeHandle *)&stack0xffffffffffffffe0);
    if ((TopicManager *)local_20._M_p != (TopicManager *)0x0) {
      TopicManager::unadvertise((TopicManager *)local_20._M_p,&this->topic_,&this->callbacks_);
    }
    this_00 = (this->node_handle_).
              super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (this->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  return;
}

Assistant:

void Publisher::Impl::unadvertise()
{
  if (!unadvertised_)
  {
    unadvertised_ = true;
    TopicManagerPtr tm = node_handle_->getTopicManager();
    if (tm)
      tm->unadvertise(topic_, callbacks_);
    node_handle_.reset();
  }
}